

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.c
# Opt level: O0

size_t tga_estimate_size(image_data image,int expand)

{
  image_data image_00;
  undefined1 auVar1 [72];
  int iVar3;
  undefined8 in_stack_ffffffffffffffd8;
  size_t sStack_10;
  int expand_local;
  undefined1 auVar2 [24];
  
  auVar1 = image._8_72_;
  image_00._72_8_ = in_stack_ffffffffffffffd8;
  auVar2 = auVar1._16_24_;
  image_00.pixels.ptr = (uchar *)SUB168(auVar1._0_16_,0);
  image_00.pixels.size = SUB168(auVar1._0_16_,8);
  image_00.palette.data.ptr = (uchar *)SUB168(auVar2._0_16_,0);
  image_00.palette.data.size = SUB168(auVar2._0_16_,8);
  image_00.palette.type = auVar2[0x10];
  image_00.palette._17_7_ = auVar2._17_7_;
  image_00.type = auVar1[0x28];
  image_00._41_3_ = auVar1._41_3_;
  image_00.width = auVar1._44_4_;
  image_00.height = auVar1._48_4_;
  image_00._52_4_ = auVar1._52_4_;
  image_00.header = (void *)auVar1._56_8_;
  image_00.userdata = (void *)auVar1._64_8_;
  iVar3 = is_supported(image_00);
  if (iVar3 == 0) {
    sStack_10 = 0;
  }
  else if (expand == 0) {
    sStack_10 = image.pixels.size + 0x312;
  }
  else {
    iVar3 = 3;
    if (image.alpha_pixels != 0) {
      iVar3 = 4;
    }
    sStack_10 = image.pixels.size * (long)iVar3 + 0x12;
  }
  return sStack_10;
}

Assistant:

size_t tga_estimate_size(struct image_data image, int expand)
{
	if (!is_supported(image)) {
		return 0;
	}
	if (expand) {
		return TGA_HEADER_SIZE + image.pixels.size * ( image.alpha_pixels ? 4 : 3 );
	} else {
		return TGA_HEADER_SIZE + image.pixels.size + 768;
	}
}